

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CpuArch.c
# Opt level: O0

BoolInt CPU_IsSupported_PageGB(void)

{
  uint local_28 [2];
  UInt32 d [4];
  uint local_c;
  
  z7_x86_cpuid(local_28,0x80000000);
  if (local_28[0] < 0x80000001) {
    local_c = 0;
  }
  else {
    z7_x86_cpuid(local_28,0x80000001);
    local_c = d[1] >> 0x1a & 1;
  }
  return local_c;
}

Assistant:

BoolInt CPU_IsSupported_PageGB(void)
{
  CHECK_CPUID_IS_SUPPORTED
  {
    UInt32 d[4];
    z7_x86_cpuid(d, 0x80000000);
    if (d[0] < 0x80000001)
      return False;
    z7_x86_cpuid(d, 0x80000001);
    return (BoolInt)(d[3] >> 26) & 1;
  }
}